

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O2

string * Json::StyledStreamWriter::normalizeEOL(string *__return_storage_ptr__,string *text)

{
  char *pcVar1;
  size_type sVar2;
  char *pcVar3;
  char *pcVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  pcVar1 = (text->_M_dataplus)._M_p;
  sVar2 = text->_M_string_length;
  pcVar3 = pcVar1;
  while (pcVar3 != pcVar1 + sVar2) {
    pcVar4 = pcVar3 + 1;
    if (*pcVar3 == '\r') {
      if (pcVar3[1] == '\n') {
        pcVar4 = pcVar3 + 2;
      }
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      pcVar3 = pcVar4;
    }
    else {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      pcVar3 = pcVar4;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StyledStreamWriter::normalizeEOL(const std::string& text) {
  std::string normalized;
  normalized.reserve(text.length());
  const char* begin = text.c_str();
  const char* end = begin + text.length();
  const char* current = begin;
  while (current != end) {
    char c = *current++;
    if (c == '\r') // mac or dos EOL
    {
      if (*current == '\n') // convert dos EOL
        ++current;
      normalized += '\n';
    } else // handle unix EOL & other char
      normalized += c;
  }
  return normalized;
}